

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall VmaBlockMetadata_Linear::CleanupAfterFree(VmaBlockMetadata_Linear *this)

{
  size_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  VmaSuballocation *pVVar4;
  VkDeviceSize VVar5;
  VkDeviceSize VVar6;
  undefined8 uVar7;
  int iVar8;
  size_t sVar9;
  VmaSuballocationType *pVVar10;
  size_t sVar11;
  long lVar12;
  size_t sVar13;
  ulong uVar14;
  size_t sVar15;
  VmaSuballocationType *pVVar16;
  size_t sVar17;
  VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *this_00;
  VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *this_01;
  bool bVar18;
  bool bVar19;
  
  bVar18 = this->m_1stVectorIndex == 0;
  bVar19 = !bVar18;
  this_01 = &this->m_Suballocations0 + bVar19;
  this_00 = &this->m_Suballocations0 + bVar18;
  iVar8 = (*(this->super_VmaBlockMetadata)._vptr_VmaBlockMetadata[7])();
  if ((char)iVar8 != '\0') {
    VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::resize(this_01,0);
    VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::resize(this_00,0);
    this->m_1stNullItemsMiddleCount = 0;
    this->m_2ndNullItemsCount = 0;
    *(undefined8 *)&this->m_2ndVectorMode = 0;
    *(undefined8 *)((long)&this->m_1stNullItemsBeginCount + 4) = 0;
    return;
  }
  uVar2 = (&this->m_Suballocations0)[bVar19].m_Count;
  uVar3 = this->m_1stNullItemsBeginCount;
  sVar17 = this->m_1stNullItemsMiddleCount;
  sVar9 = sVar17;
  if (uVar3 < uVar2) {
    pVVar10 = &(&this->m_Suballocations0)[bVar19].m_pArray[uVar3].type;
    uVar14 = uVar3;
    do {
      uVar14 = uVar14 + 1;
      if (*pVVar10 != VMA_SUBALLOCATION_TYPE_FREE) break;
      this->m_1stNullItemsBeginCount = uVar14;
      sVar9 = sVar9 - 1;
      this->m_1stNullItemsMiddleCount = sVar9;
      pVVar10 = pVVar10 + 8;
    } while (uVar14 != uVar2);
  }
  while ((sVar9 != 0 &&
         (sVar15 = (&this->m_Suballocations0)[bVar19].m_Count,
         (&this->m_Suballocations0)[bVar19].m_pArray[sVar15 - 1].type == VMA_SUBALLOCATION_TYPE_FREE
         ))) {
    this->m_1stNullItemsMiddleCount = sVar9 - 1;
    VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::resize(this_01,sVar15 - 1);
    sVar9 = this->m_1stNullItemsMiddleCount;
  }
  while (sVar9 = this->m_2ndNullItemsCount, sVar9 != 0) {
    sVar15 = (&this->m_Suballocations0)[bVar18].m_Count;
    if ((&this->m_Suballocations0)[bVar18].m_pArray[sVar15 - 1].type != VMA_SUBALLOCATION_TYPE_FREE)
    goto LAB_001b87a8;
    this->m_2ndNullItemsCount = sVar9 - 1;
    VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::resize(this_00,sVar15 - 1);
  }
  goto LAB_001b87b2;
  while( true ) {
    this->m_2ndNullItemsCount = sVar9 - 1;
    sVar9 = (&this->m_Suballocations0)[bVar18].m_Count - 1;
    if (sVar9 != 0) {
      memmove(pVVar4,pVVar4 + 1,sVar9 * 0x20);
    }
    VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::resize(this_00,sVar9);
    sVar9 = this->m_2ndNullItemsCount;
    if (sVar9 == 0) break;
LAB_001b87a8:
    pVVar4 = (&this->m_Suballocations0)[bVar18].m_pArray;
    if (pVVar4->type != VMA_SUBALLOCATION_TYPE_FREE) break;
  }
LAB_001b87b2:
  psVar1 = &this->m_1stNullItemsBeginCount;
  uVar14 = (&this->m_Suballocations0)[this->m_1stVectorIndex != 0].m_Count;
  if ((0x20 < uVar14) &&
     (sVar9 = this->m_1stNullItemsBeginCount, lVar12 = this->m_1stNullItemsMiddleCount + sVar9,
     (uVar14 - lVar12) * 3 <= (ulong)(lVar12 * 2))) {
    sVar17 = uVar2 - (uVar3 + sVar17);
    if (sVar17 != 0) {
      sVar15 = 0;
      do {
        pVVar4 = (&this->m_Suballocations0)[bVar19].m_pArray;
        pVVar10 = &pVVar4[sVar9].type;
        do {
          pVVar16 = pVVar10;
          sVar9 = sVar9 + 1;
          pVVar10 = pVVar16 + 8;
        } while (*pVVar16 == VMA_SUBALLOCATION_TYPE_FREE);
        sVar13 = sVar15 + 1;
        if (sVar13 != sVar9) {
          VVar5 = ((VmaSuballocation *)(pVVar16 + -6))->offset;
          VVar6 = *(VkDeviceSize *)(pVVar16 + -4);
          uVar7 = *(undefined8 *)pVVar16;
          pVVar4[sVar15].userData = *(void **)(pVVar16 + -2);
          (&pVVar4[sVar15].userData)[1] = (void *)uVar7;
          pVVar4[sVar15].offset = VVar5;
          pVVar4[sVar15].size = VVar6;
        }
        sVar15 = sVar13;
      } while (sVar13 != sVar17);
    }
    VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::resize(this_01,sVar17);
    *psVar1 = 0;
    this->m_1stNullItemsMiddleCount = 0;
  }
  if ((&this->m_Suballocations0)[bVar18].m_Count == 0) {
    this->m_2ndVectorMode = SECOND_VECTOR_EMPTY;
  }
  if ((&this->m_Suballocations0)[bVar19].m_Count == *psVar1) {
    VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::resize(this_01,0);
    *psVar1 = 0;
    sVar17 = (&this->m_Suballocations0)[bVar18].m_Count;
    if ((sVar17 != 0) && (this->m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER)) {
      this->m_2ndVectorMode = SECOND_VECTOR_EMPTY;
      sVar9 = this->m_2ndNullItemsCount;
      sVar13 = sVar9 - sVar17;
      pVVar10 = &((&this->m_Suballocations0)[bVar18].m_pArray)->type;
      sVar15 = 1;
      do {
        sVar11 = sVar9;
        if (*pVVar10 != VMA_SUBALLOCATION_TYPE_FREE) break;
        *psVar1 = sVar15;
        sVar9 = sVar9 - 1;
        pVVar10 = pVVar10 + 8;
        bVar19 = sVar15 != sVar17;
        sVar11 = sVar13;
        sVar15 = sVar15 + 1;
      } while (bVar19);
      this->m_1stNullItemsMiddleCount = sVar11;
      this->m_2ndNullItemsCount = 0;
      *(byte *)&this->m_1stVectorIndex = (byte)this->m_1stVectorIndex ^ 1;
    }
  }
  return;
}

Assistant:

void VmaBlockMetadata_Linear::CleanupAfterFree()
{
    SuballocationVectorType& suballocations1st = AccessSuballocations1st();
    SuballocationVectorType& suballocations2nd = AccessSuballocations2nd();

    if (IsEmpty())
    {
        suballocations1st.clear();
        suballocations2nd.clear();
        m_1stNullItemsBeginCount = 0;
        m_1stNullItemsMiddleCount = 0;
        m_2ndNullItemsCount = 0;
        m_2ndVectorMode = SECOND_VECTOR_EMPTY;
    }
    else
    {
        const size_t suballoc1stCount = suballocations1st.size();
        const size_t nullItem1stCount = m_1stNullItemsBeginCount + m_1stNullItemsMiddleCount;
        VMA_ASSERT(nullItem1stCount <= suballoc1stCount);

        // Find more null items at the beginning of 1st vector.
        while (m_1stNullItemsBeginCount < suballoc1stCount &&
            suballocations1st[m_1stNullItemsBeginCount].type == VMA_SUBALLOCATION_TYPE_FREE)
        {
            ++m_1stNullItemsBeginCount;
            --m_1stNullItemsMiddleCount;
        }

        // Find more null items at the end of 1st vector.
        while (m_1stNullItemsMiddleCount > 0 &&
            suballocations1st.back().type == VMA_SUBALLOCATION_TYPE_FREE)
        {
            --m_1stNullItemsMiddleCount;
            suballocations1st.pop_back();
        }

        // Find more null items at the end of 2nd vector.
        while (m_2ndNullItemsCount > 0 &&
            suballocations2nd.back().type == VMA_SUBALLOCATION_TYPE_FREE)
        {
            --m_2ndNullItemsCount;
            suballocations2nd.pop_back();
        }

        // Find more null items at the beginning of 2nd vector.
        while (m_2ndNullItemsCount > 0 &&
            suballocations2nd[0].type == VMA_SUBALLOCATION_TYPE_FREE)
        {
            --m_2ndNullItemsCount;
            VmaVectorRemove(suballocations2nd, 0);
        }

        if (ShouldCompact1st())
        {
            const size_t nonNullItemCount = suballoc1stCount - nullItem1stCount;
            size_t srcIndex = m_1stNullItemsBeginCount;
            for (size_t dstIndex = 0; dstIndex < nonNullItemCount; ++dstIndex)
            {
                while (suballocations1st[srcIndex].type == VMA_SUBALLOCATION_TYPE_FREE)
                {
                    ++srcIndex;
                }
                if (dstIndex != srcIndex)
                {
                    suballocations1st[dstIndex] = suballocations1st[srcIndex];
                }
                ++srcIndex;
            }
            suballocations1st.resize(nonNullItemCount);
            m_1stNullItemsBeginCount = 0;
            m_1stNullItemsMiddleCount = 0;
        }

        // 2nd vector became empty.
        if (suballocations2nd.empty())
        {
            m_2ndVectorMode = SECOND_VECTOR_EMPTY;
        }

        // 1st vector became empty.
        if (suballocations1st.size() - m_1stNullItemsBeginCount == 0)
        {
            suballocations1st.clear();
            m_1stNullItemsBeginCount = 0;

            if (!suballocations2nd.empty() && m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER)
            {
                // Swap 1st with 2nd. Now 2nd is empty.
                m_2ndVectorMode = SECOND_VECTOR_EMPTY;
                m_1stNullItemsMiddleCount = m_2ndNullItemsCount;
                while (m_1stNullItemsBeginCount < suballocations2nd.size() &&
                    suballocations2nd[m_1stNullItemsBeginCount].type == VMA_SUBALLOCATION_TYPE_FREE)
                {
                    ++m_1stNullItemsBeginCount;
                    --m_1stNullItemsMiddleCount;
                }
                m_2ndNullItemsCount = 0;
                m_1stVectorIndex ^= 1;
            }
        }
    }

    VMA_HEAVY_ASSERT(Validate());
}